

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

string * phosg::get_user_home_directory_abi_cxx11_(void)

{
  __uid_t __uid;
  int iVar1;
  char *pcVar2;
  long lVar3;
  runtime_error *prVar4;
  size_type __n;
  string *in_RDI;
  allocator<char> local_91;
  passwd *local_90;
  passwd *result;
  passwd pwd;
  undefined1 local_50 [8];
  string buffer;
  int bufsize;
  allocator<char> local_19;
  char *local_18;
  char *homedir;
  
  pcVar2 = getenv("HOME");
  local_18 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    lVar3 = sysconf(0x46);
    buffer.field_2._8_4_ = (undefined4)lVar3;
    if (buffer.field_2._8_4_ == -1) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar4,"can\'t get _SC_GETPW_R_SIZE_MAX");
      __cxa_throw(prVar4,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    __n = (size_type)(int)buffer.field_2._8_4_;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,__n,'\0',(allocator<char> *)((long)&pwd.pw_shell + 7));
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&pwd.pw_shell + 7));
    local_90 = (passwd *)0x0;
    __uid = getuid();
    pcVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_50);
    iVar1 = getpwuid_r(__uid,(passwd *)&result,pcVar2,(long)(int)buffer.field_2._8_4_,&local_90);
    if ((iVar1 != 0) || (local_90 == (passwd *)0x0)) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar4,"can\'t get home directory for current user");
      __cxa_throw(prVar4,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,pwd.pw_gecos,&local_91);
    ::std::allocator<char>::~allocator(&local_91);
    ::std::__cxx11::string::~string((string *)local_50);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,pcVar2,&local_19);
    ::std::allocator<char>::~allocator(&local_19);
  }
  return in_RDI;
}

Assistant:

string get_user_home_directory() {
  const char* homedir = getenv("HOME");
  if (homedir) {
    return homedir;
  }

  int bufsize = sysconf(_SC_GETPW_R_SIZE_MAX);
  if (bufsize == -1) {
    throw runtime_error("can\'t get _SC_GETPW_R_SIZE_MAX");
  }

  string buffer(bufsize, '\0');
  struct passwd pwd, *result = nullptr;
  if (getpwuid_r(getuid(), &pwd, buffer.data(), bufsize, &result) != 0 || !result) {
    throw runtime_error("can\'t get home directory for current user");
  }

  return pwd.pw_dir;
}